

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  PassRunner *pPVar1;
  Expression *pEVar2;
  bool bVar3;
  Drop *pDVar4;
  Block *pBVar5;
  int64_t iVar6;
  Load *pLVar7;
  Store *pSVar8;
  ulong extraout_RDX;
  ulong uVar9;
  ulong extraout_RDX_00;
  initializer_list<wasm::Expression_*> *items;
  optional<wasm::Type> type;
  Drop local_70;
  Drop local_58;
  Expression *local_40;
  Builder local_38;
  Builder builder;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((((pPVar1->options).ignoreImplicitTraps != false) ||
      ((pPVar1->options).trapsNeverHappen == true)) &&
     (bVar3 = areConsecutiveInputsEqual(this,memCopy->dest,memCopy->source), bVar3)) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pEVar2 = memCopy->dest;
    pDVar4 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar4->value = pEVar2;
    Drop::finalize(pDVar4);
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = pDVar4;
    pDVar4 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar4->value = pEVar2;
    Drop::finalize(pDVar4);
    pEVar2 = memCopy->size;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)pDVar4;
    pDVar4 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar4->value = pEVar2;
    Drop::finalize(pDVar4);
    items = (initializer_list<wasm::Expression_*> *)&local_70;
    local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 3;
    uVar9 = extraout_RDX;
    local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = &local_58;
    local_58.value = (Expression *)pDVar4;
LAB_009e2bef:
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar9;
    pBVar5 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_38,items,type);
    return (Expression *)pBVar5;
  }
  if (memCopy->size->_id != ConstId) {
    return (Expression *)0x0;
  }
  iVar6 = Literal::getInteger((Literal *)(memCopy->size + 1));
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  switch(iVar6) {
  case 0:
    if (((pPVar1->options).ignoreImplicitTraps != false) ||
       ((pPVar1->options).trapsNeverHappen == true)) {
      pEVar2 = memCopy->dest;
      pDVar4 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar4->value = pEVar2;
      Drop::finalize(pDVar4);
      pEVar2 = memCopy->source;
      local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = pDVar4;
      pDVar4 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar4->value = pEVar2;
      Drop::finalize(pDVar4);
      items = (initializer_list<wasm::Expression_*> *)&local_58;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
      uVar9 = extraout_RDX_00;
      local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)pDVar4;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = &local_70
      ;
      goto LAB_009e2bef;
    }
    break;
  case 1:
  case 2:
  case 4:
    local_40 = memCopy->dest;
    local_70.value = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    pLVar7 = (Load *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    pLVar7->signed_ = false;
    (pLVar7->offset).addr = 0;
    (pLVar7->align).addr = 0;
    pLVar7->isAtomic = false;
    pLVar7->bytes = (uint8_t)iVar6;
    (pLVar7->offset).addr = 0;
    (pLVar7->align).addr = 1;
    pLVar7->ptr = local_70.value;
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (pLVar7->memory).super_IString.str._M_len =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pLVar7->memory).super_IString.str._M_str =
         (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Load::finalize(pLVar7);
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->destMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->destMemory).super_IString.str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    pSVar8->ptr = (Expression *)0x0;
    pSVar8->value = (Expression *)0x0;
    (pSVar8->valueType).id = 0;
    (pSVar8->memory).super_IString.str._M_len = 0;
    (pSVar8->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    pSVar8->isAtomic = false;
    pSVar8->bytes = (uint8_t)iVar6;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 1;
    pSVar8->ptr = local_40;
    pSVar8->value = (Expression *)pLVar7;
    (pSVar8->valueType).id = 2;
    goto LAB_009e2e95;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    local_40 = memCopy->dest;
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    pLVar7 = (Load *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    (pLVar7->offset).addr = 0;
    (pLVar7->align).addr = 0;
    pLVar7->isAtomic = false;
    pLVar7->bytes = '\b';
    pLVar7->signed_ = false;
    (pLVar7->offset).addr = 0;
    (pLVar7->align).addr = 1;
    pLVar7->ptr = pEVar2;
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 3;
    (pLVar7->memory).super_IString.str._M_len =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pLVar7->memory).super_IString.str._M_str =
         (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Load::finalize(pLVar7);
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->destMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->destMemory).super_IString.str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    pSVar8->ptr = (Expression *)0x0;
    pSVar8->value = (Expression *)0x0;
    (pSVar8->valueType).id = 0;
    (pSVar8->memory).super_IString.str._M_len = 0;
    (pSVar8->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    pSVar8->isAtomic = false;
    pSVar8->bytes = '\b';
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 1;
    pSVar8->ptr = local_40;
    pSVar8->value = (Expression *)pLVar7;
    (pSVar8->valueType).id = 3;
LAB_009e2e95:
    (pSVar8->memory).super_IString.str._M_len =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pSVar8->memory).super_IString.str._M_str =
         (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Store::finalize(pSVar8);
    return (Expression *)pSVar8;
  default:
    if (iVar6 != 0x10) {
      return (Expression *)0x0;
    }
    if (((pPVar1->options).shrinkLevel == 0) && ((((local_38.wasm)->features).features & 8) != 0)) {
      pEVar2 = memCopy->dest;
      pLVar7 = Builder::makeLoad(&local_38,0x10,false,(Address)0x0,1,memCopy->source,(Type)0x6,
                                 (Name)(memCopy->sourceMemory).super_IString.str);
      pSVar8 = Builder::makeStore(&local_38,0x10,(Address)0x0,1,pEVar2,(Expression *)pLVar7,
                                  (Type)0x6,(Name)(memCopy->destMemory).super_IString.str);
      return (Expression *)pSVar8;
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }